

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void BailOutRecord::UpdatePolymorphicFieldAccess
               (JavascriptFunction *function,BailOutRecord *bailOutRecord)

{
  code *pcVar1;
  bool bVar2;
  DynamicProfileInfo *this;
  undefined4 *puVar3;
  PolymorphicInlineCache *this_00;
  FunctionBody *local_38;
  PolymorphicInlineCache *polymorphicInlineCache;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *executeFunction;
  BailOutRecord *bailOutRecord_local;
  JavascriptFunction *function_local;
  
  bVar2 = IsShared(bailOutRecord);
  if (bVar2) {
    local_38 = (FunctionBody *)bailOutRecord[1].globalBailOutRecordTable;
  }
  else {
    local_38 = Js::JavascriptFunction::GetFunctionBody(function);
  }
  bVar2 = Js::FunctionBody::HasDynamicProfileInfo(local_38);
  if (bVar2) {
    this = Js::FunctionBody::GetAnyDynamicProfileInfo(local_38);
    if (this == (DynamicProfileInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x571,"(dynamicProfileInfo)","dynamicProfileInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (bailOutRecord->polymorphicCacheIndex != 0xffffffff) {
      Js::DynamicProfileInfo::RecordPolymorphicFieldAccess
                (this,local_38,bailOutRecord->polymorphicCacheIndex);
      bVar2 = IR::IsEquivalentTypeCheckBailOutKind(bailOutRecord->bailOutKind);
      if ((bVar2) &&
         (this_00 = Js::FunctionBody::GetPolymorphicInlineCache
                              (local_38,bailOutRecord->polymorphicCacheIndex),
         this_00 != (PolymorphicInlineCache *)0x0)) {
        Js::PolymorphicInlineCache::SetIgnoreForEquivalentObjTypeSpec(this_00,true);
      }
    }
  }
  return;
}

Assistant:

void BailOutRecord::UpdatePolymorphicFieldAccess(Js::JavascriptFunction * function, BailOutRecord const * bailOutRecord)
{
    Js::FunctionBody * executeFunction = bailOutRecord->IsShared() ? ((SharedBailOutRecord*)bailOutRecord)->functionBody : function->GetFunctionBody();
    Js::DynamicProfileInfo *dynamicProfileInfo = nullptr;
    if (executeFunction->HasDynamicProfileInfo())
    {
        dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        Assert(dynamicProfileInfo);

        if (bailOutRecord->polymorphicCacheIndex != (uint)-1)
        {
            dynamicProfileInfo->RecordPolymorphicFieldAccess(executeFunction, bailOutRecord->polymorphicCacheIndex);
            if (IR::IsEquivalentTypeCheckBailOutKind(bailOutRecord->bailOutKind))
            {
                // If we've already got a polymorphic inline cache, and if we've got an equivalent type check
                // bailout here, make sure we don't try any more equivalent obj type spec using that cache.
                Js::PolymorphicInlineCache *polymorphicInlineCache = executeFunction->GetPolymorphicInlineCache(
                    bailOutRecord->polymorphicCacheIndex);
                if (polymorphicInlineCache)
                {
                    polymorphicInlineCache->SetIgnoreForEquivalentObjTypeSpec(true);
                }
            }
        }
    }
}